

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O2

void T1_Size_Done(FT_Size t1size)

{
  PSH_Globals_Funcs pPVar1;
  T1_Size size;
  
  if (t1size->internal->module_data != (void *)0x0) {
    pPVar1 = T1_Size_Get_Globals_Funcs((T1_Size)t1size);
    if (pPVar1 != (PSH_Globals_Funcs)0x0) {
      (*pPVar1->destroy)((PSH_Globals)t1size->internal->module_data);
    }
    t1size->internal->module_data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Size_Done( FT_Size  t1size )          /* T1_Size */
  {
    T1_Size  size = (T1_Size)t1size;


    if ( t1size->internal->module_data )
    {
      PSH_Globals_Funcs  funcs;


      funcs = T1_Size_Get_Globals_Funcs( size );
      if ( funcs )
        funcs->destroy( (PSH_Globals)t1size->internal->module_data );

      t1size->internal->module_data = NULL;
    }
  }